

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParticleArrayTests.cpp
# Opt level: O2

void __thiscall
ParticleArrayTest_Assignment_Test<pica::ParticleArraySoA<pica::Particle<(pica::Dimension)2>_>_>::
TestBody(ParticleArrayTest_Assignment_Test<pica::ParticleArraySoA<pica::Particle<(pica::Dimension)2>_>_>
         *this)

{
  Particle<(pica::Dimension)2> particle;
  Particle<(pica::Dimension)2> particle_00;
  int iVar1;
  bool bVar2;
  AssertHelper local_310;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_308;
  String local_300;
  AssertionResult gtest_ar_;
  Particle local_2e0;
  Particle local_2a0;
  ParticleArray particles;
  ParticleArray particlesCopy;
  ParticleArray particlesAnotherCopy;
  
  memset(&particles,0,0xc0);
  memset(&particlesCopy,0,0xc0);
  memset(&particlesAnotherCopy,0,0xc0);
  iVar1 = 9;
  while (bVar2 = iVar1 != 0, iVar1 = iVar1 + -1, bVar2) {
    BaseParticleFixture<pica::Particle<(pica::Dimension)2>_>::randomParticle
              (&local_2a0,(BaseParticleFixture<pica::Particle<(pica::Dimension)2>_> *)this);
    particle.position.y = local_2a0.position.y;
    particle.position.x = local_2a0.position.x;
    particle.p.x = local_2a0.p.x;
    particle.p.y = local_2a0.p.y;
    particle.p.z = local_2a0.p.z;
    particle.factor = local_2a0.factor;
    particle.invGamma = local_2a0.invGamma;
    particle.typeIndex = local_2a0.typeIndex;
    particle._58_6_ = local_2a0._58_6_;
    pica::ParticleArraySoA<pica::Particle<(pica::Dimension)2>>::
    pushBack<pica::Particle<(pica::Dimension)2>>
              ((ParticleArraySoA<pica::Particle<(pica::Dimension)2>> *)&particles,particle);
  }
  iVar1 = 0xb;
  while (bVar2 = iVar1 != 0, iVar1 = iVar1 + -1, bVar2) {
    BaseParticleFixture<pica::Particle<(pica::Dimension)2>_>::randomParticle
              (&local_2e0,(BaseParticleFixture<pica::Particle<(pica::Dimension)2>_> *)this);
    particle_00.position.y = local_2e0.position.y;
    particle_00.position.x = local_2e0.position.x;
    particle_00.p.x = local_2e0.p.x;
    particle_00.p.y = local_2e0.p.y;
    particle_00.p.z = local_2e0.p.z;
    particle_00.factor = local_2e0.factor;
    particle_00.invGamma = local_2e0.invGamma;
    particle_00.typeIndex = local_2e0.typeIndex;
    particle_00._58_6_ = local_2e0._58_6_;
    pica::ParticleArraySoA<pica::Particle<(pica::Dimension)2>>::
    pushBack<pica::Particle<(pica::Dimension)2>>
              ((ParticleArraySoA<pica::Particle<(pica::Dimension)2>> *)&particlesCopy,particle_00);
  }
  pica::ParticleArraySoA<pica::Particle<(pica::Dimension)2>_>::operator=(&particlesCopy,&particles);
  pica::ParticleArraySoA<pica::Particle<(pica::Dimension)2>_>::operator=
            (&particlesAnotherCopy,&particles);
  gtest_ar_.success_ =
       ParticleArrayTest<pica::ParticleArraySoA<pica::Particle<(pica::Dimension)2>_>_>::
       eqParticleArrays(&this->
                         super_ParticleArrayTest<pica::ParticleArraySoA<pica::Particle<(pica::Dimension)2>_>_>
                        ,&particles,&particlesCopy);
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  if (gtest_ar_.success_) {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar_.message_);
    gtest_ar_.success_ =
         ParticleArrayTest<pica::ParticleArraySoA<pica::Particle<(pica::Dimension)2>_>_>::
         eqParticleArrays(&this->
                           super_ParticleArrayTest<pica::ParticleArraySoA<pica::Particle<(pica::Dimension)2>_>_>
                          ,&particles,&particlesAnotherCopy);
    gtest_ar_.message_.ptr_ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (gtest_ar_.success_) goto LAB_0019d1e7;
    testing::Message::Message((Message *)&local_308);
    testing::internal::GetBoolAssertionFailureMessage
              ((internal *)&local_300,&gtest_ar_,
               "this->eqParticleArrays(particles, particlesAnotherCopy)","false","true");
    testing::internal::AssertHelper::AssertHelper
              (&local_310,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/pictools[P]pica/test/src/particles/ParticleArrayTests.cpp"
               ,0x3a,local_300.c_str_);
    testing::internal::AssertHelper::operator=(&local_310,(Message *)&local_308);
  }
  else {
    testing::Message::Message((Message *)&local_308);
    testing::internal::GetBoolAssertionFailureMessage
              ((internal *)&local_300,&gtest_ar_,"this->eqParticleArrays(particles, particlesCopy)",
               "false","true");
    testing::internal::AssertHelper::AssertHelper
              (&local_310,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/pictools[P]pica/test/src/particles/ParticleArrayTests.cpp"
               ,0x39,local_300.c_str_);
    testing::internal::AssertHelper::operator=(&local_310,(Message *)&local_308);
  }
  testing::internal::AssertHelper::~AssertHelper(&local_310);
  testing::internal::String::~String(&local_300);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr(&local_308);
LAB_0019d1e7:
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  pica::ParticleArraySoA<pica::Particle<(pica::Dimension)2>_>::~ParticleArraySoA
            (&particlesAnotherCopy);
  pica::ParticleArraySoA<pica::Particle<(pica::Dimension)2>_>::~ParticleArraySoA(&particlesCopy);
  pica::ParticleArraySoA<pica::Particle<(pica::Dimension)2>_>::~ParticleArraySoA(&particles);
  return;
}

Assistant:

TYPED_TEST(ParticleArrayTest, Assignment)
{
    typedef typename ParticleArrayTest<TypeParam>::ParticleArray ParticleArray;

    ParticleArray particles, particlesCopy, particlesAnotherCopy;
    for (int i = 0; i < 9; i++)
        particles.pushBack(this->randomParticle());
    for (int i = 0; i < 11; i++)
        particlesCopy.pushBack(this->randomParticle());
    particlesCopy = particles;
    particlesAnotherCopy = particles;
    ASSERT_TRUE(this->eqParticleArrays(particles, particlesCopy));
    ASSERT_TRUE(this->eqParticleArrays(particles, particlesAnotherCopy));
}